

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O2

void __thiscall setup::item::load_condition_data(item *this,istream *is,info *i)

{
  bool bVar1;
  encoded_string local_38;
  
  if ((i->version).value < 0x2000000) {
    bVar1 = version::is_isx(&i->version);
    if ((bVar1) && (0x10307ff < (i->version).value)) goto LAB_00139cc1;
    (this->components)._M_string_length = 0;
    *(this->components)._M_dataplus._M_p = '\0';
  }
  else {
LAB_00139cc1:
    local_38.codepage = i->codepage;
    local_38.lead_byte_set = (bitset<256UL> *)0x0;
    local_38.data = &this->components;
    util::operator>>(is,&local_38);
  }
  if ((i->version).value < 0x2000000) {
    bVar1 = version::is_isx(&i->version);
    if ((bVar1) && (0x10310ff < (i->version).value)) goto LAB_00139d06;
    (this->tasks)._M_string_length = 0;
    *(this->tasks)._M_dataplus._M_p = '\0';
  }
  else {
LAB_00139d06:
    local_38.data = &this->tasks;
    local_38.codepage = i->codepage;
    local_38.lead_byte_set = (bitset<256UL> *)0x0;
    util::operator>>(is,&local_38);
  }
  if ((i->version).value < 0x4000100) {
    (this->languages)._M_string_length = 0;
    *(this->languages)._M_dataplus._M_p = '\0';
  }
  else {
    local_38.data = &this->languages;
    local_38.codepage = i->codepage;
    local_38.lead_byte_set = (bitset<256UL> *)0x0;
    util::operator>>(is,&local_38);
  }
  if ((i->version).value < 0x4000000) {
    bVar1 = version::is_isx(&i->version);
    if ((!bVar1) || ((i->version).value < 0x1031800)) {
      (this->check)._M_string_length = 0;
      *(this->check)._M_dataplus._M_p = '\0';
      goto LAB_00139db1;
    }
  }
  local_38.data = &this->check;
  local_38.codepage = i->codepage;
  local_38.lead_byte_set = (bitset<256UL> *)0x0;
  util::operator>>(is,&local_38);
LAB_00139db1:
  if ((i->version).value < 0x4010000) {
    (this->after_install)._M_string_length = 0;
    *(this->after_install)._M_dataplus._M_p = '\0';
    (this->before_install)._M_string_length = 0;
    *(this->before_install)._M_dataplus._M_p = '\0';
  }
  else {
    local_38.data = &this->after_install;
    local_38.codepage = i->codepage;
    local_38.lead_byte_set = (bitset<256UL> *)0x0;
    util::operator>>(is,&local_38);
    local_38.data = &this->before_install;
    local_38.codepage = i->codepage;
    local_38.lead_byte_set = (bitset<256UL> *)0x0;
    util::operator>>(is,&local_38);
  }
  return;
}

Assistant:

void item::load_condition_data(std::istream & is, const info & i) {
	
	if(i.version >= INNO_VERSION(2, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 8))) {
		is >> util::encoded_string(components, i.codepage);
	} else {
		components.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 17))) {
		is >> util::encoded_string(tasks, i.codepage);
	} else {
		tasks.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		is >> util::encoded_string(after_install, i.codepage);
		is >> util::encoded_string(before_install, i.codepage);
	} else {
		after_install.clear(), before_install.clear();
	}
	
}